

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessConfig
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  Value *pVVar7;
  string *this_00;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_02;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string sStack_208;
  ByteArray pskc;
  Value local_1d0;
  format_string_checker<char> local_188;
  string local_158;
  string local_138;
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 local_50 [40];
  
  this_01 = &sStack_208;
  this_00 = &sStack_208;
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_188._0_8_ = local_188._0_8_ & 0xffffffff00000000;
    local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_188.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_188.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_188.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_188.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "too few arguments";
    local_188.context_.types_ = local_188.types_;
    while (pcVar5 = pcVar6, pcVar5 != "") {
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",&local_188);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_188;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_208,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    this_02 = (string *)(local_50 + 8);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_02,(string *)&sStack_208);
    Value::Value(&local_1d0,(Error *)local_50);
  }
  else {
    bVar4 = std::operator==(pbVar2 + 2,"pskc");
    if ((bVar4) ||
       (bVar4 = std::operator==((aExpr->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2,"admincode"), bVar4))
    {
      bVar4 = std::operator==((aExpr->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"get");
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        bVar4 = std::operator==(pbVar2 + 2,"admincode");
        if (bVar4) {
          std::__cxx11::string::string
                    ((string *)&local_138,(string *)&this->mThreadAdministratorPasscode);
          Value::Value(&local_1d0,&local_138);
          Value::operator=(__return_storage_ptr__,&local_1d0);
          Value::~Value(&local_1d0);
          this_00 = &local_138;
        }
        else {
          JobManager::GetDefaultConfigPSKc_abi_cxx11_
                    (&local_158,
                     (this->mJobManager).
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          Value::Value(&local_1d0,&local_158);
          Value::operator=(__return_storage_ptr__,&local_1d0);
          Value::~Value(&local_1d0);
          this_00 = &local_158;
        }
        goto LAB_00114e78;
      }
      bVar4 = std::operator==(pbVar2 + 1,"set");
      if (bVar4) {
        pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
          local_188._0_8_ = (ulong)(uint)local_188._4_4_ << 0x20;
          local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "too few arguments";
          local_188.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
          local_188.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_188.context_.super_basic_format_parse_context<char>._20_4_ = 0;
          local_188.parse_funcs_[0] = (parse_func)0x0;
          pcVar6 = "too few arguments";
          local_188.context_.types_ = local_188.types_;
          while (pcVar5 = pcVar6, pcVar5 != "") {
            pcVar6 = pcVar5 + 1;
            if (*pcVar5 == '}') {
              if ((pcVar6 == "") || (*pcVar6 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar6 = pcVar5 + 2;
            }
            else if (*pcVar5 == '{') {
              pcVar6 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar5,"",&local_188);
            }
          }
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_188;
          ::fmt::v10::vformat_abi_cxx11_
                    (&sStack_208,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
          local_a0._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&sStack_208);
          Value::Value(&local_1d0,(Error *)local_a0);
          Value::operator=(__return_storage_ptr__,&local_1d0);
          Value::~Value(&local_1d0);
          std::__cxx11::string::~string((string *)(local_a0 + 8));
        }
        else {
          bVar4 = std::operator==(pbVar2 + 2,"admincode");
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&this->mThreadAdministratorPasscode);
            pcVar3 = (this->mThreadAdministratorPasscode)._M_dataplus._M_p;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pskc,pcVar3,
                       pcVar3 + (this->mThreadAdministratorPasscode)._M_string_length);
          }
          else {
            utils::Hex((Error *)local_f0,&pskc,
                       (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 3);
            Value::Value(&local_1d0,(Error *)local_f0);
            pVVar7 = Value::operator=(__return_storage_ptr__,&local_1d0);
            EVar1 = (pVVar7->mError).mCode;
            Value::~Value(&local_1d0);
            std::__cxx11::string::~string((string *)(local_f0 + 8));
            if (EVar1 != kNone) goto LAB_001152a5;
          }
          JobManager::UpdateDefaultConfigPSKc
                    ((Error *)local_118,
                     (this->mJobManager).
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&pskc);
          Value::Value(&local_1d0,(Error *)local_118);
          Value::operator=(__return_storage_ptr__,&local_1d0);
          Value::~Value(&local_1d0);
          this_01 = (string *)(local_118 + 8);
        }
        std::__cxx11::string::~string((string *)this_01);
LAB_001152a5:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return __return_storage_ptr__;
      }
      local_188.types_[0] = string_type;
      local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "\'{}\' is not a valid sub-command";
      local_188.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
      local_188.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_188.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_188.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      pcVar6 = "\'{}\' is not a valid sub-command";
      local_188.context_.types_ = local_188.types_;
      while (pcVar5 = pcVar6, pcVar5 != "") {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",&local_188);
        }
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_188._0_8_ = pbVar2[1]._M_dataplus._M_p;
      local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)pbVar2[1]._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1f;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_188;
      ::fmt::v10::vformat_abi_cxx11_
                (&sStack_208,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_01);
      this_02 = (string *)(local_c8 + 8);
      local_c8._0_4_ = kInvalidCommand;
      std::__cxx11::string::string(this_02,(string *)&sStack_208);
      Value::Value(&local_1d0,(Error *)local_c8);
    }
    else {
      local_188.types_[0] = string_type;
      local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "{} is not a valid property";
      local_188.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1a;
      local_188.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_188.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_188.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      pcVar6 = "{} is not a valid property";
      local_188.context_.types_ = local_188.types_;
      while (pcVar5 = pcVar6, pcVar5 != "") {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",&local_188);
        }
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_188._0_8_ = pbVar2[2]._M_dataplus._M_p;
      local_188.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)pbVar2[2]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1a;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_188;
      ::fmt::v10::vformat_abi_cxx11_(&sStack_208,(v10 *)"{} is not a valid property",fmt,args_00);
      this_02 = (string *)(local_78 + 8);
      local_78._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_02,(string *)&sStack_208);
      Value::Value(&local_1d0,(Error *)local_78);
    }
  }
  Value::operator=(__return_storage_ptr__,&local_1d0);
  Value::~Value(&local_1d0);
  std::__cxx11::string::~string(this_02);
LAB_00114e78:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessConfig(const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit(aExpr[2] == "pskc" || aExpr[2] == "admincode",
                 value = ERROR_INVALID_ARGS("{} is not a valid property", aExpr[2]));
    if (aExpr[1] == "get")
    {
        if (aExpr[2] == "admincode")
        {
            ExitNow(value = mThreadAdministratorPasscode);
        }

        value = mJobManager->GetDefaultConfigPSKc();
    }
    else if (aExpr[1] == "set")
    {
        ByteArray pskc;

        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        if (aExpr[2] == "admincode")
        {
            mThreadAdministratorPasscode = aExpr[3];

            // TODO(rongli@): add len and last digit check per SPEC-1216v11
            pskc.assign(mThreadAdministratorPasscode.begin(), mThreadAdministratorPasscode.end());
        }
        else
        {
            SuccessOrExit(value = utils::Hex(pskc, aExpr[3]));
        }
        SuccessOrExit(value = mJobManager->UpdateDefaultConfigPSKc(pskc));
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}